

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_183::InfoCollector::visitTry(InfoCollector *this,Try *curr)

{
  Pop *pPVar1;
  char *pcVar2;
  CollectedFuncInfo *this_00;
  string_view name;
  bool bVar3;
  size_t sVar4;
  Name *pNVar5;
  Expression **ppEVar6;
  Module *this_01;
  Tag *this_02;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  Type *pTVar10;
  ExpressionLocation local_108;
  TagLocation local_f8;
  undefined1 local_e0 [64];
  uintptr_t local_a0;
  uint local_94;
  Expression *pEStack_90;
  Index i;
  Pop *pop;
  char *local_80;
  Type local_78;
  Type params;
  Expression *body;
  Name tag;
  Index tagIndex;
  size_t numTags;
  Expression *catchBody;
  Iterator __end2;
  Iterator __begin2;
  ExpressionList *__range2;
  Try *curr_local;
  InfoCollector *this_local;
  
  receiveChildValue(this,curr->body,(Expression *)curr);
  join_0x00000010_0x00000000_ =
       ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                 (&(curr->catchBodies).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  _catchBody = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                         (&(curr->catchBodies).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
  while (bVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator!=((Iterator *)&__end2.index,(Iterator *)&catchBody), bVar3) {
    ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator*((Iterator *)&__end2.index);
    receiveChildValue(this,*ppEVar6,(Expression *)curr);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
              ((Iterator *)&__end2.index);
  }
  sVar4 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                    (&(curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
  tag.super_IString.str._M_str._4_4_ = 0;
  do {
    if (sVar4 <= tag.super_IString.str._M_str._4_4_) {
      return;
    }
    pNVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(curr->catchTags).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                        (ulong)tag.super_IString.str._M_str._4_4_);
    pPVar1 = (Pop *)(pNVar5->super_IString).str._M_len;
    pcVar2 = (pNVar5->super_IString).str._M_str;
    name = (pNVar5->super_IString).str;
    ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&(curr->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(ulong)tag.super_IString.str._M_str._4_4_);
    params.id = (uintptr_t)*ppEVar6;
    this_01 = Walker<wasm::(anonymous_namespace)::InfoCollector,_wasm::OverriddenVisitor<wasm::(anonymous_namespace)::InfoCollector,_void>_>
              ::getModule((Walker<wasm::(anonymous_namespace)::InfoCollector,_wasm::OverriddenVisitor<wasm::(anonymous_namespace)::InfoCollector,_void>_>
                           *)this);
    pop = pPVar1;
    local_80 = pcVar2;
    this_02 = Module::getTag(this_01,(Name)name);
    local_78 = wasm::Tag::params(this_02);
    sVar7 = wasm::Type::size(&local_78);
    if (sVar7 != 0) {
      pEStack_90 = (Expression *)EHUtils::findPop((Expression *)params.id);
      if (pEStack_90 == (Expression *)0x0) {
        __assert_fail("pop",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                      ,0x49c,"void wasm::(anonymous namespace)::InfoCollector::visitTry(Try *)");
      }
      sVar7 = wasm::Type::size(&pEStack_90->type);
      sVar8 = wasm::Type::size(&local_78);
      if (sVar7 != sVar8) {
        __assert_fail("pop->type.size() == params.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                      ,0x49d,"void wasm::(anonymous namespace)::InfoCollector::visitTry(Try *)");
      }
      for (local_94 = 0; uVar9 = (ulong)local_94, sVar7 = wasm::Type::size(&local_78), uVar9 < sVar7
          ; local_94 = local_94 + 1) {
        pTVar10 = wasm::Type::operator[](&local_78,(ulong)local_94);
        local_a0 = pTVar10->id;
        bVar3 = isRelevant(this,(Type)local_a0);
        if (bVar3) {
          this_00 = this->info;
          local_f8.tupleIndex = local_94;
          local_f8.tag.super_IString.str._M_len = (size_t)pPVar1;
          local_f8.tag.super_IString.str._M_str = pcVar2;
          std::
          variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
          ::variant<wasm::TagLocation,void,void,wasm::TagLocation,void>
                    ((variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
                      *)local_e0,&local_f8);
          local_108.expr = pEStack_90;
          local_108.tupleIndex = local_94;
          std::
          variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
          ::variant<wasm::ExpressionLocation,void,void,wasm::ExpressionLocation,void>
                    ((variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
                      *)(local_e0 + 0x20),&local_108);
          std::
          vector<wasm::(anonymous_namespace)::Link<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::allocator<wasm::(anonymous_namespace)::Link<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>_>_>
          ::push_back(&this_00->links,(value_type *)local_e0);
        }
      }
      this->handledPops = this->handledPops + 1;
    }
    tag.super_IString.str._M_str._4_4_ = tag.super_IString.str._M_str._4_4_ + 1;
  } while( true );
}

Assistant:

void visitTry(Try* curr) {
    receiveChildValue(curr->body, curr);
    for (auto* catchBody : curr->catchBodies) {
      receiveChildValue(catchBody, curr);
    }

    auto numTags = curr->catchTags.size();
    for (Index tagIndex = 0; tagIndex < numTags; tagIndex++) {
      auto tag = curr->catchTags[tagIndex];
      auto* body = curr->catchBodies[tagIndex];

      auto params = getModule()->getTag(tag)->params();
      if (params.size() == 0) {
        continue;
      }

      // Find the pop of the tag's contents. The body must start with such a
      // pop, which might be of a tuple.
      auto* pop = EHUtils::findPop(body);
      // There must be a pop since we checked earlier if it was an empty tag,
      // and would not reach here.
      assert(pop);
      assert(pop->type.size() == params.size());
      for (Index i = 0; i < params.size(); i++) {
        if (isRelevant(params[i])) {
          info.links.push_back(
            {TagLocation{tag, i}, ExpressionLocation{pop, i}});
        }
      }

#ifndef NDEBUG
      // This pop was in the position we can handle, note that (see visitPop
      // for details).
      handledPops++;
#endif
    }
  }